

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O1

void __thiscall cmCTestMultiProcessHandler::PrintOutputAsJson(cmCTestMultiProcessHandler *this)

{
  float fVar1;
  cmCTestTestHandler *pcVar2;
  ValueHolder value;
  bool bVar3;
  int iVar4;
  _Rb_tree_node_base *p_Var5;
  Value *pVVar6;
  string *value_00;
  _Base_ptr p_Var7;
  StreamWriter *pSVar8;
  _Rb_tree_color _Var9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commandAndArgs;
  Value properties;
  ArrayIndex backtrace;
  Value testInfo;
  Value result;
  Value tests;
  cmWorkingDirectory workdir;
  StreamWriterBuilder builder;
  BacktraceData backtraceGraph;
  ValueHolder local_9a0;
  ValueHolder local_998;
  undefined4 local_990;
  undefined1 uStack_98c;
  undefined1 uStack_98b;
  undefined1 uStack_98a;
  undefined1 uStack_989;
  undefined1 uStack_988;
  undefined1 uStack_987;
  undefined1 uStack_986;
  undefined1 uStack_985;
  undefined1 uStack_984;
  undefined1 uStack_983;
  undefined1 local_982;
  string local_978;
  ValueHolder local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  Value local_930;
  ValueHolder local_908 [5];
  ValueHolder local_8e0;
  undefined8 local_8d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8d0;
  cmCTestMultiProcessHandler *local_8b8;
  ValueHolder local_8b0;
  undefined8 local_8a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8a0;
  _Base_ptr local_888;
  string *local_880;
  _Base_ptr local_878;
  Value local_870;
  string local_848;
  Value local_828;
  Value local_800;
  Value local_7d8;
  ValueHolder local_7b0 [5];
  Value local_788;
  Value local_760;
  ValueHolder local_738 [5];
  Value local_710;
  Value local_6e8;
  Value local_6c0;
  Value local_698;
  cmWorkingDirectory local_670;
  Value local_648;
  Value local_620;
  Value local_5f8;
  Value local_5d0;
  Value local_5a8;
  Value local_580;
  Value local_558;
  Value local_530;
  Value local_508;
  Value local_4e0;
  Value local_4b8;
  Value local_490;
  Value local_468;
  Value local_440;
  Value local_418;
  Value local_3f0;
  Value local_3c8;
  Value local_3a0;
  ValueHolder local_378 [3];
  cmCTest *local_360;
  unique_ptr<cmProcess,_std::default_delete<cmProcess>_> local_358;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340;
  cmCTestTestResult local_330;
  undefined4 local_1f8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  value_type local_1a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_180 [2];
  BacktraceData local_150;
  
  pcVar2 = this->TestHandler;
  _Var9 = _S_red;
  local_8b8 = this;
  for (p_Var5 = (this->Tests).
                super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 !=
      &(this->Tests).
       super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
       ._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    if ((int)_Var9 < (int)p_Var5[1]._M_color) {
      _Var9 = p_Var5[1]._M_color;
    }
  }
  pcVar2->MaxIndex = _Var9;
  Json::Value::Value(&local_828,objectValue);
  Json::Value::Value(&local_698,"ctestInfo");
  pVVar6 = Json::Value::operator[](&local_828,"kind");
  Json::Value::operator=(pVVar6,&local_698);
  Json::Value::~Value(&local_698);
  Json::Value::Value(&local_800,objectValue);
  Json::Value::Value((Value *)local_378,1);
  pVVar6 = Json::Value::operator[](&local_800,"major");
  Json::Value::operator=(pVVar6,(Value *)local_378);
  Json::Value::~Value((Value *)local_378);
  Json::Value::Value((Value *)&local_150,0);
  pVVar6 = Json::Value::operator[](&local_800,"minor");
  Json::Value::operator=(pVVar6,(Value *)&local_150);
  Json::Value::~Value((Value *)&local_150);
  pVVar6 = Json::Value::operator[](&local_828,"version");
  Json::Value::operator=(pVVar6,&local_800);
  Json::Value::~Value(&local_800);
  BacktraceData::BacktraceData(&local_150);
  Json::Value::Value(&local_760,arrayValue);
  p_Var7 = (local_8b8->Properties).
           super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_888 = &(local_8b8->Properties).
               super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
               ._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var7 != local_888) {
    do {
      value = (ValueHolder)p_Var7[1]._M_parent;
      local_880 = (string *)&((value.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right;
      local_878 = p_Var7;
      cmWorkingDirectory::cmWorkingDirectory(&local_670,local_880);
      cmCTestRunTest::cmCTestRunTest((cmCTestRunTest *)local_378,local_8b8);
      local_1f8 = *(undefined4 *)(value.int_ + 0x158);
      local_378[0] = value;
      cmCTestRunTest::ComputeArguments((cmCTestRunTest *)local_378);
      if (((ulong)((long)*(_Base_ptr *)(value.int_ + 0x48) - *(long *)(value.int_ + 0x40)) < 0x21)
         || (iVar4 = std::__cxx11::string::compare((char *)(*(long *)(value.int_ + 0x40) + 0x20)),
            iVar4 != 0)) {
        Json::Value::Value(&local_870,objectValue);
        Json::Value::Value(&local_5f8,(string *)value.map_);
        pVVar6 = Json::Value::operator[](&local_870,"name");
        Json::Value::operator=(pVVar6,&local_5f8);
        Json::Value::~Value(&local_5f8);
        value_00 = cmCTest::GetConfigType_abi_cxx11_(local_360);
        if (value_00->_M_string_length != 0) {
          Json::Value::Value(&local_620,value_00);
          pVVar6 = Json::Value::operator[](&local_870,"config");
          Json::Value::operator=(pVVar6,&local_620);
          Json::Value::~Value(&local_620);
        }
        if (local_1a0._M_string_length != 0) {
          local_958.int_ = 0;
          uStack_950 = 0;
          local_948 = 0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_958,&local_1a0);
          if (local_180[0].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_180[0].
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_958,
                      ((long)local_180[0].
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_180[0].
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_958,uStack_950,
                       local_180[0].
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       local_180[0].
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
          }
          DumpToJsonArray(&local_648,
                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_958);
          pVVar6 = Json::Value::operator[](&local_870,"command");
          Json::Value::operator=(pVVar6,&local_648);
          Json::Value::~Value(&local_648);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_958);
        }
        Json::Value::Value(&local_930,arrayValue);
        if (*(_Base_ptr *)(value.int_ + 0xa0) != *(_Base_ptr *)(value.int_ + 0xa8)) {
          local_908[0].int_ = 0x16;
          local_9a0.string_ = (char *)&local_990;
          local_9a0.int_ = std::__cxx11::string::_M_create(&local_9a0.uint_,(ulong)local_908);
          local_990 = (undefined4)local_908[0].int_;
          uStack_98c = (undefined1)((ulong)local_908[0] >> 0x20);
          uStack_98b = (undefined1)((ulong)local_908[0] >> 0x28);
          uStack_98a = (undefined1)((ulong)local_908[0] >> 0x30);
          uStack_989 = (undefined1)((ulong)local_908[0] >> 0x38);
          builtin_strncpy((char *)local_9a0,"ATTACHED",8);
          *(undefined8 *)&((local_9a0.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header =
               0x4f5f53454c49465f;
          *(undefined8 *)&((local_9a0.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header.field_0x6
               = 0x4c4941465f4e4f5f;
          local_998.int_ = local_908[0].int_;
          local_9a0.string_[local_908[0].string_] = '\0';
          DumpToJsonArray(&local_3a0,
                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(value.int_ + 0xa0));
          DumpCTestProperty((Value *)&local_958,(string *)&local_9a0,&local_3a0);
          Json::Value::append(&local_930,(Value *)&local_958);
          Json::Value::~Value((Value *)&local_958);
          Json::Value::~Value(&local_3a0);
          if (local_9a0 != &local_990) {
            operator_delete(local_9a0.string_,
                            CONCAT17(uStack_989,
                                     CONCAT16(uStack_98a,
                                              CONCAT15(uStack_98b,CONCAT14(uStack_98c,local_990))))
                            + 1);
          }
        }
        if (*(_Base_ptr *)(value.int_ + 0x88) !=
            (_Base_ptr)
            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(value.int_ + 0x90))->_M_allocated_capacity) {
          uStack_988 = 0x5f;
          uStack_987 = 0x46;
          uStack_986 = 0x49;
          uStack_985 = 0x4c;
          uStack_984 = 0x45;
          uStack_983 = 0x53;
          local_990 = 0x41545441;
          uStack_98c = 0x43;
          uStack_98b = 0x48;
          uStack_98a = 0x45;
          uStack_989 = 0x44;
          local_998.int_ = 0xe;
          local_982 = 0;
          local_9a0.string_ = (char *)&local_990;
          DumpToJsonArray(&local_3c8,
                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(value.int_ + 0x88));
          DumpCTestProperty((Value *)&local_958,(string *)&local_9a0,&local_3c8);
          Json::Value::append(&local_930,(Value *)&local_958);
          Json::Value::~Value((Value *)&local_958);
          Json::Value::~Value(&local_3c8);
          if (local_9a0 != &local_990) {
            operator_delete(local_9a0.string_,
                            CONCAT17(uStack_989,
                                     CONCAT16(uStack_98a,
                                              CONCAT15(uStack_98b,CONCAT14(uStack_98c,local_990))))
                            + 1);
          }
        }
        fVar1 = *(float *)(value.int_ + 0x134);
        if ((fVar1 != 0.0) || (NAN(fVar1))) {
          local_990 = 0x54534f43;
          local_998.int_ = 4;
          uStack_98c = 0;
          local_9a0.string_ = (char *)&local_990;
          Json::Value::Value(&local_3f0,(double)fVar1);
          DumpCTestProperty((Value *)&local_958,(string *)&local_9a0,&local_3f0);
          Json::Value::append(&local_930,(Value *)&local_958);
          Json::Value::~Value((Value *)&local_958);
          Json::Value::~Value(&local_3f0);
          if (local_9a0 != &local_990) {
            operator_delete(local_9a0.string_,
                            CONCAT17(uStack_989,
                                     CONCAT16(uStack_98a,
                                              CONCAT15(uStack_98b,CONCAT14(uStack_98c,local_990))))
                            + 1);
          }
        }
        if ((_Base_ptr)
            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(value.int_ + 0x70))->_M_allocated_capacity != *(_Base_ptr *)(value.int_ + 0x78)) {
          uStack_98c = 0x4e;
          uStack_98b = 0x44;
          uStack_98a = 0x53;
          local_990 = 0x45504544;
          local_998.int_ = 7;
          uStack_989 = 0;
          local_9a0.string_ = (char *)&local_990;
          DumpToJsonArray(&local_418,
                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(value.int_ + 0x70));
          DumpCTestProperty((Value *)&local_958,(string *)&local_9a0,&local_418);
          Json::Value::append(&local_930,(Value *)&local_958);
          Json::Value::~Value((Value *)&local_958);
          Json::Value::~Value(&local_418);
          if (local_9a0 != &local_990) {
            operator_delete(local_9a0.string_,
                            CONCAT17(uStack_989,
                                     CONCAT16(uStack_98a,
                                              CONCAT15(uStack_98b,CONCAT14(uStack_98c,local_990))))
                            + 1);
          }
        }
        if (*(char *)(value.int_ + 0x132) == '\x01') {
          local_990 = 0x41534944;
          uStack_98c = 0x42;
          uStack_98b = 0x4c;
          uStack_98a = 0x45;
          uStack_989 = 0x44;
          local_998.int_ = 8;
          uStack_988 = 0;
          local_9a0.string_ = (char *)&local_990;
          Json::Value::Value(&local_440,true);
          DumpCTestProperty((Value *)&local_958,(string *)&local_9a0,&local_440);
          Json::Value::append(&local_930,(Value *)&local_958);
          Json::Value::~Value((Value *)&local_958);
          Json::Value::~Value(&local_440);
          if (local_9a0 != &local_990) {
            operator_delete(local_9a0.string_,
                            CONCAT17(uStack_989,
                                     CONCAT16(uStack_98a,
                                              CONCAT15(uStack_98b,CONCAT14(uStack_98c,local_990))))
                            + 1);
          }
        }
        if (*(_Base_ptr *)(value.int_ + 0x188) !=
            (_Base_ptr)
            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(value.int_ + 400))->_M_allocated_capacity) {
          local_990 = 0x49564e45;
          uStack_98c = 0x52;
          uStack_98b = 0x4f;
          uStack_98a = 0x4e;
          uStack_989 = 0x4d;
          uStack_988 = 0x45;
          uStack_987 = 0x4e;
          uStack_986 = 0x54;
          local_998.int_ = 0xb;
          uStack_985 = 0;
          local_9a0.string_ = (char *)&local_990;
          DumpToJsonArray(&local_468,
                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(value.int_ + 0x188));
          DumpCTestProperty((Value *)&local_958,(string *)&local_9a0,&local_468);
          Json::Value::append(&local_930,(Value *)&local_958);
          Json::Value::~Value((Value *)&local_958);
          Json::Value::~Value(&local_468);
          if (local_9a0 != &local_990) {
            operator_delete(local_9a0.string_,
                            CONCAT17(uStack_989,
                                     CONCAT16(uStack_98a,
                                              CONCAT15(uStack_98b,CONCAT14(uStack_98c,local_990))))
                            + 1);
          }
        }
        if (*(_Base_ptr *)(value.int_ + 0xb8) != *(_Base_ptr *)(value.int_ + 0xc0)) {
          local_908[0].int_ = 0x17;
          local_9a0.string_ = (char *)&local_990;
          local_9a0.int_ = std::__cxx11::string::_M_create(&local_9a0.uint_,(ulong)local_908);
          local_990 = (undefined4)local_908[0].int_;
          uStack_98c = (undefined1)((ulong)local_908[0] >> 0x20);
          uStack_98b = (undefined1)((ulong)local_908[0] >> 0x28);
          uStack_98a = (undefined1)((ulong)local_908[0] >> 0x30);
          uStack_989 = (undefined1)((ulong)local_908[0] >> 0x38);
          builtin_strncpy((char *)local_9a0,"FAIL_REG",8);
          *(undefined8 *)&((local_9a0.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header =
               0x5058455f52414c55;
          *(undefined8 *)&((local_9a0.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header.field_0x7
               = 0x4e4f495353455250;
          local_998.int_ = local_908[0].int_;
          local_9a0.string_[local_908[0].string_] = '\0';
          DumpRegExToJsonArray
                    (&local_490,
                     (vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)(value.int_ + 0xb8));
          DumpCTestProperty((Value *)&local_958,(string *)&local_9a0,&local_490);
          Json::Value::append(&local_930,(Value *)&local_958);
          Json::Value::~Value((Value *)&local_958);
          Json::Value::~Value(&local_490);
          if (local_9a0 != &local_990) {
            operator_delete(local_9a0.string_,
                            CONCAT17(uStack_989,
                                     CONCAT16(uStack_98a,
                                              CONCAT15(uStack_98b,CONCAT14(uStack_98c,local_990))))
                            + 1);
          }
        }
        if (*(long *)(value.int_ + 0x240) != 0) {
          local_908[0].int_ = 0x10;
          local_9a0.string_ = (char *)&local_990;
          local_9a0.int_ = std::__cxx11::string::_M_create(&local_9a0.uint_,(ulong)local_908);
          local_990 = (undefined4)local_908[0].int_;
          uStack_98c = (undefined1)((ulong)local_908[0] >> 0x20);
          uStack_98b = (undefined1)((ulong)local_908[0] >> 0x28);
          uStack_98a = (undefined1)((ulong)local_908[0] >> 0x30);
          uStack_989 = (undefined1)((ulong)local_908[0] >> 0x38);
          builtin_strncpy((char *)local_9a0,"FIXTURES",8);
          *(undefined8 *)&((local_9a0.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header =
               0x50554e41454c435f;
          local_998.int_ = local_908[0].int_;
          local_9a0.string_[local_908[0].string_] = '\0';
          DumpToJsonArray(&local_4b8,
                          (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(value.int_ + 0x218));
          DumpCTestProperty((Value *)&local_958,(string *)&local_9a0,&local_4b8);
          Json::Value::append(&local_930,(Value *)&local_958);
          Json::Value::~Value((Value *)&local_958);
          Json::Value::~Value(&local_4b8);
          if (local_9a0 != &local_990) {
            operator_delete(local_9a0.string_,
                            CONCAT17(uStack_989,
                                     CONCAT16(uStack_98a,
                                              CONCAT15(uStack_98b,CONCAT14(uStack_98c,local_990))))
                            + 1);
          }
        }
        if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(value.int_ + 0x270))->_M_allocated_capacity != 0) {
          local_908[0].int_ = 0x11;
          local_9a0.string_ = (char *)&local_990;
          local_9a0.int_ = std::__cxx11::string::_M_create(&local_9a0.uint_,(ulong)local_908);
          local_990 = (undefined4)local_908[0].int_;
          uStack_98c = (undefined1)((ulong)local_908[0] >> 0x20);
          uStack_98b = (undefined1)((ulong)local_908[0] >> 0x28);
          uStack_98a = (undefined1)((ulong)local_908[0] >> 0x30);
          uStack_989 = (undefined1)((ulong)local_908[0] >> 0x38);
          builtin_strncpy((char *)local_9a0,"FIXTURES",8);
          *(undefined8 *)&((local_9a0.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header =
               0x455249555145525f;
          *(undefined1 *)&((local_9a0.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent
               = 0x44;
          local_998.int_ = local_908[0].int_;
          local_9a0.string_[local_908[0].string_] = '\0';
          DumpToJsonArray(&local_4e0,
                          (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(value.int_ + 0x248));
          DumpCTestProperty((Value *)&local_958,(string *)&local_9a0,&local_4e0);
          Json::Value::append(&local_930,(Value *)&local_958);
          Json::Value::~Value((Value *)&local_958);
          Json::Value::~Value(&local_4e0);
          if (local_9a0 != &local_990) {
            operator_delete(local_9a0.string_,
                            CONCAT17(uStack_989,
                                     CONCAT16(uStack_98a,
                                              CONCAT15(uStack_98b,CONCAT14(uStack_98c,local_990))))
                            + 1);
          }
        }
        if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(value.int_ + 0x210))->_M_allocated_capacity != 0) {
          uStack_988 = 0x5f;
          uStack_987 = 0x53;
          uStack_986 = 0x45;
          uStack_985 = 0x54;
          uStack_984 = 0x55;
          uStack_983 = 0x50;
          local_990 = 0x54584946;
          uStack_98c = 0x55;
          uStack_98b = 0x52;
          uStack_98a = 0x45;
          uStack_989 = 0x53;
          local_998.int_ = 0xe;
          local_982 = 0;
          local_9a0.string_ = (char *)&local_990;
          DumpToJsonArray(&local_508,
                          (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(value.int_ + 0x1e8));
          DumpCTestProperty((Value *)&local_958,(string *)&local_9a0,&local_508);
          Json::Value::append(&local_930,(Value *)&local_958);
          Json::Value::~Value((Value *)&local_958);
          Json::Value::~Value(&local_508);
          if (local_9a0 != &local_990) {
            operator_delete(local_9a0.string_,
                            CONCAT17(uStack_989,
                                     CONCAT16(uStack_98a,
                                              CONCAT15(uStack_98b,CONCAT14(uStack_98c,local_990))))
                            + 1);
          }
        }
        if (*(_Base_ptr *)(value.int_ + 0x1a0) != *(_Base_ptr *)(value.int_ + 0x1a8)) {
          uStack_98c = 0x4c;
          uStack_98b = 0x53;
          local_990 = 0x4542414c;
          local_998.int_ = 6;
          uStack_98a = 0;
          local_9a0.string_ = (char *)&local_990;
          DumpToJsonArray(&local_530,
                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(value.int_ + 0x1a0));
          DumpCTestProperty((Value *)&local_958,(string *)&local_9a0,&local_530);
          Json::Value::append(&local_930,(Value *)&local_958);
          Json::Value::~Value((Value *)&local_958);
          Json::Value::~Value(&local_530);
          if (local_9a0 != &local_990) {
            operator_delete(local_9a0.string_,
                            CONCAT17(uStack_989,
                                     CONCAT16(uStack_98a,
                                              CONCAT15(uStack_98b,CONCAT14(uStack_98c,local_990))))
                            + 1);
          }
        }
        if (*(_Base_ptr *)(value.int_ + 0x128) != (_Base_ptr)0x0) {
          local_8b0.string_ = (char *)&local_8a0;
          local_8a0._M_allocated_capacity._0_7_ = 0x4552555341454d;
          local_8a0._7_4_ = 0x544e454d;
          local_8a8 = 0xb;
          local_8a0._M_local_buf[0xb] = '\0';
          Json::Value::Value(&local_788,arrayValue);
          for (p_Var5 = *(_Base_ptr *)(value.int_ + 0x118);
              p_Var5 != (_Rb_tree_node_base *)(value.int_ + 0x108);
              p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
            Json::Value::Value((Value *)&local_958,objectValue);
            Json::Value::Value((Value *)&local_9a0,(string *)(p_Var5 + 1));
            pVVar6 = Json::Value::operator[]((Value *)&local_958,"measurement");
            Json::Value::operator=(pVVar6,(Value *)&local_9a0);
            Json::Value::~Value((Value *)&local_9a0);
            Json::Value::Value((Value *)local_908,(string *)(p_Var5 + 2));
            pVVar6 = Json::Value::operator[]((Value *)&local_958,"value");
            Json::Value::operator=(pVVar6,(Value *)local_908);
            Json::Value::~Value((Value *)local_908);
            Json::Value::append(&local_788,(Value *)&local_958);
            Json::Value::~Value((Value *)&local_958);
          }
          DumpCTestProperty((Value *)local_7b0,(string *)&local_8b0,&local_788);
          Json::Value::append(&local_930,(Value *)local_7b0);
          Json::Value::~Value((Value *)local_7b0);
          Json::Value::~Value(&local_788);
          if (local_8b0 != &local_8a0) {
            operator_delete(local_8b0.string_,
                            CONCAT17(local_8a0._M_local_buf[7],local_8a0._M_allocated_capacity._0_7_
                                    ) + 1);
          }
        }
        if ((_Base_ptr)
            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(value.int_ + 0xd0))->_M_allocated_capacity != *(_Base_ptr *)(value.int_ + 0xd8)) {
          local_908[0].int_ = 0x17;
          local_9a0.string_ = (char *)&local_990;
          local_9a0.int_ = std::__cxx11::string::_M_create(&local_9a0.uint_,(ulong)local_908);
          local_990 = (undefined4)local_908[0].int_;
          uStack_98c = (undefined1)((ulong)local_908[0] >> 0x20);
          uStack_98b = (undefined1)((ulong)local_908[0] >> 0x28);
          uStack_98a = (undefined1)((ulong)local_908[0] >> 0x30);
          uStack_989 = (undefined1)((ulong)local_908[0] >> 0x38);
          builtin_strncpy((char *)local_9a0,"PASS_REG",8);
          *(undefined8 *)&((local_9a0.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header =
               0x5058455f52414c55;
          *(undefined8 *)&((local_9a0.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header.field_0x7
               = 0x4e4f495353455250;
          local_998.int_ = local_908[0].int_;
          local_9a0.string_[local_908[0].string_] = '\0';
          DumpRegExToJsonArray
                    ((Value *)local_908,
                     (vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)(value.int_ + 0xd0));
          DumpCTestProperty((Value *)&local_958,(string *)&local_9a0,(Value *)local_908);
          Json::Value::append(&local_930,(Value *)&local_958);
          Json::Value::~Value((Value *)&local_958);
          Json::Value::~Value((Value *)local_908);
          if (local_9a0 != &local_990) {
            operator_delete(local_9a0.string_,
                            CONCAT17(uStack_989,
                                     CONCAT16(uStack_98a,
                                              CONCAT15(uStack_98b,CONCAT14(uStack_98c,local_990))))
                            + 1);
          }
        }
        if (*(char *)&((_Alloc_hider *)&((_Base_ptr)(value.int_ + 0x160))->_M_color)->_M_p == '\x01'
           ) {
          local_7b0[0].int_ = 0x12;
          local_9a0.string_ = (char *)&local_990;
          local_9a0.int_ = std::__cxx11::string::_M_create(&local_9a0.uint_,(ulong)local_7b0);
          local_990 = (undefined4)local_7b0[0].int_;
          uStack_98c = (undefined1)((ulong)local_7b0[0] >> 0x20);
          uStack_98b = (undefined1)((ulong)local_7b0[0] >> 0x28);
          uStack_98a = (undefined1)((ulong)local_7b0[0] >> 0x30);
          uStack_989 = (undefined1)((ulong)local_7b0[0] >> 0x38);
          builtin_strncpy((char *)local_9a0,"PROCESSO",8);
          *(undefined8 *)&((local_9a0.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header =
               0x494e494646415f52;
          *(undefined2 *)&((local_9a0.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent
               = 0x5954;
          local_998.int_ = local_7b0[0].int_;
          local_9a0.string_[local_7b0[0].string_] = '\0';
          Json::Value::Value((Value *)local_7b0,
                             *(bool *)&((_Alloc_hider *)&((_Base_ptr)(value.int_ + 0x160))->_M_color
                                       )->_M_p);
          DumpCTestProperty((Value *)&local_958,(string *)&local_9a0,(Value *)local_7b0);
          Json::Value::append(&local_930,(Value *)&local_958);
          Json::Value::~Value((Value *)&local_958);
          Json::Value::~Value((Value *)local_7b0);
          if (local_9a0 != &local_990) {
            operator_delete(local_9a0.string_,
                            CONCAT17(uStack_989,
                                     CONCAT16(uStack_98a,
                                              CONCAT15(uStack_98b,CONCAT14(uStack_98c,local_990))))
                            + 1);
          }
        }
        if (*(int *)(value.int_ + 0x15c) != 1) {
          local_990 = 0x434f5250;
          uStack_98c = 0x45;
          uStack_98b = 0x53;
          uStack_98a = 0x53;
          uStack_989 = 0x4f;
          uStack_988 = 0x52;
          uStack_987 = 0x53;
          local_998.int_ = 10;
          uStack_986 = 0;
          local_9a0.string_ = (char *)&local_990;
          Json::Value::Value((Value *)&local_8b0,*(int *)(value.int_ + 0x15c));
          DumpCTestProperty((Value *)&local_958,(string *)&local_9a0,(Value *)&local_8b0);
          Json::Value::append(&local_930,(Value *)&local_958);
          Json::Value::~Value((Value *)&local_958);
          Json::Value::~Value((Value *)&local_8b0);
          if (local_9a0 != &local_990) {
            operator_delete(local_9a0.string_,
                            CONCAT17(uStack_989,
                                     CONCAT16(uStack_98a,
                                              CONCAT15(uStack_98b,CONCAT14(uStack_98c,local_990))))
                            + 1);
          }
        }
        if (*(_Base_ptr *)(value.int_ + 0x58) != *(_Base_ptr *)(value.int_ + 0x60)) {
          DumpToJsonArray(&local_558,
                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(value.int_ + 0x58));
          pVVar6 = Json::Value::operator[](&local_930,"REQUIRED_FILES");
          Json::Value::operator=(pVVar6,&local_558);
          Json::Value::~Value(&local_558);
        }
        if (*(long *)(value.int_ + 0x1e0) != 0) {
          uStack_988 = 0x5f;
          uStack_987 = 0x4c;
          uStack_986 = 0x4f;
          uStack_985 = 0x43;
          uStack_984 = 0x4b;
          local_990 = 0x4f534552;
          uStack_98c = 0x55;
          uStack_98b = 0x52;
          uStack_98a = 0x43;
          uStack_989 = 0x45;
          local_998.int_ = 0xd;
          uStack_983 = 0;
          local_9a0.string_ = (char *)&local_990;
          DumpToJsonArray(&local_580,
                          (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(value.int_ + 0x1b8));
          DumpCTestProperty((Value *)&local_958,(string *)&local_9a0,&local_580);
          Json::Value::append(&local_930,(Value *)&local_958);
          Json::Value::~Value((Value *)&local_958);
          Json::Value::~Value(&local_580);
          if (local_9a0 != &local_990) {
            operator_delete(local_9a0.string_,
                            CONCAT17(uStack_989,
                                     CONCAT16(uStack_98a,
                                              CONCAT15(uStack_98b,CONCAT14(uStack_98c,local_990))))
                            + 1);
          }
        }
        if (*(char *)(value.int_ + 0x13c) == '\x01') {
          local_990 = 0x5f4e5552;
          uStack_98c = 0x53;
          uStack_98b = 0x45;
          uStack_98a = 0x52;
          uStack_989 = 0x49;
          uStack_988 = 0x41;
          uStack_987 = 0x4c;
          local_998.int_ = 10;
          uStack_986 = 0;
          local_9a0.string_ = (char *)&local_990;
          Json::Value::Value(&local_5a8,true);
          DumpCTestProperty((Value *)&local_958,(string *)&local_9a0,&local_5a8);
          Json::Value::append(&local_930,(Value *)&local_958);
          Json::Value::~Value((Value *)&local_958);
          Json::Value::~Value(&local_5a8);
          if (local_9a0 != &local_990) {
            operator_delete(local_9a0.string_,
                            CONCAT17(uStack_989,
                                     CONCAT16(uStack_98a,
                                              CONCAT15(uStack_98b,CONCAT14(uStack_98c,local_990))))
                            + 1);
          }
        }
        if (*(int *)&((_Alloc_hider *)&((_Base_ptr)(value.int_ + 0x180))->_M_color)->_M_p != -1) {
          local_738[0].int_ = 0x10;
          local_9a0.string_ = (char *)&local_990;
          local_9a0.int_ = std::__cxx11::string::_M_create(&local_9a0.uint_,(ulong)local_738);
          local_990 = (undefined4)local_738[0].int_;
          uStack_98c = (undefined1)((ulong)local_738[0] >> 0x20);
          uStack_98b = (undefined1)((ulong)local_738[0] >> 0x28);
          uStack_98a = (undefined1)((ulong)local_738[0] >> 0x30);
          uStack_989 = (undefined1)((ulong)local_738[0] >> 0x38);
          builtin_strncpy((char *)local_9a0,"SKIP_RET",8);
          *(undefined8 *)&((local_9a0.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header =
               0x45444f435f4e5255;
          local_998.int_ = local_738[0].int_;
          local_9a0.string_[local_738[0].string_] = '\0';
          Json::Value::Value((Value *)local_738,
                             *(Int *)&((_Alloc_hider *)&((_Base_ptr)(value.int_ + 0x180))->_M_color)
                                      ->_M_p);
          DumpCTestProperty((Value *)&local_958,(string *)&local_9a0,(Value *)local_738);
          Json::Value::append(&local_930,(Value *)&local_958);
          Json::Value::~Value((Value *)&local_958);
          Json::Value::~Value((Value *)local_738);
          if (local_9a0 != &local_990) {
            operator_delete(local_9a0.string_,
                            CONCAT17(uStack_989,
                                     CONCAT16(uStack_98a,
                                              CONCAT15(uStack_98b,CONCAT14(uStack_98c,local_990))))
                            + 1);
          }
        }
        if (*(char *)(value.int_ + 0x148) == '\x01') {
          uStack_98c = 0x4f;
          uStack_98b = 0x55;
          uStack_98a = 0x54;
          local_990 = 0x454d4954;
          local_998.int_ = 7;
          uStack_989 = 0;
          local_9a0.string_ = (char *)&local_990;
          Json::Value::Value(&local_5d0,*(double *)(value.int_ + 0x140));
          DumpCTestProperty((Value *)&local_958,(string *)&local_9a0,&local_5d0);
          Json::Value::append(&local_930,(Value *)&local_958);
          Json::Value::~Value((Value *)&local_958);
          Json::Value::~Value(&local_5d0);
          if (local_9a0 != &local_990) {
            operator_delete(local_9a0.string_,
                            CONCAT17(uStack_989,
                                     CONCAT16(uStack_98a,
                                              CONCAT15(uStack_98b,CONCAT14(uStack_98c,local_990))))
                            + 1);
          }
        }
        if (*(_Base_ptr *)(value.int_ + 0xe8) !=
            (_Base_ptr)
            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(value.int_ + 0xf0))->_M_allocated_capacity) {
          local_978._M_dataplus._M_p = (pointer)&local_978.field_2;
          local_958.int_ = 0x13;
          local_978._M_dataplus._M_p =
               (pointer)std::__cxx11::string::_M_create((ulong *)&local_978,(ulong)&local_958);
          local_978.field_2._M_allocated_capacity = (size_type)local_958;
          builtin_strncpy(local_978._M_dataplus._M_p,"TIMEOUT_AFTER_MATCH",0x13);
          local_978._M_string_length = (size_type)local_958;
          local_978._M_dataplus._M_p[local_958.string_] = '\0';
          Json::Value::Value(&local_7d8,objectValue);
          Json::Value::Value((Value *)&local_958,
                             (double)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)(value.int_ + 0x150))->_M_allocated_capacity);
          pVVar6 = Json::Value::operator[](&local_7d8,"timeout");
          Json::Value::operator=(pVVar6,(Value *)&local_958);
          Json::Value::~Value((Value *)&local_958);
          DumpRegExToJsonArray
                    ((Value *)&local_9a0,
                     (vector<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<cmsys::RegularExpression,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)(value.int_ + 0xe8));
          pVVar6 = Json::Value::operator[](&local_7d8,"regex");
          Json::Value::operator=(pVVar6,(Value *)&local_9a0);
          Json::Value::~Value((Value *)&local_9a0);
          DumpCTestProperty((Value *)&local_8e0,&local_978,&local_7d8);
          Json::Value::append(&local_930,(Value *)&local_8e0);
          Json::Value::~Value((Value *)&local_8e0);
          Json::Value::~Value(&local_7d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_978._M_dataplus._M_p != &local_978.field_2) {
            operator_delete(local_978._M_dataplus._M_p,local_978.field_2._M_allocated_capacity + 1);
          }
        }
        if (*(char *)(value.int_ + 0x131) == '\x01') {
          local_8e0.string_ = (char *)&local_8d0;
          local_8d0._M_allocated_capacity = 0x4941465f4c4c4957;
          local_8d0._M_local_buf[8] = 'L';
          local_8d8 = 9;
          local_8d0._M_local_buf[9] = '\0';
          Json::Value::Value((Value *)&local_9a0,true);
          DumpCTestProperty((Value *)&local_958,(string *)&local_8e0,(Value *)&local_9a0);
          Json::Value::append(&local_930,(Value *)&local_958);
          Json::Value::~Value((Value *)&local_958);
          Json::Value::~Value((Value *)&local_9a0);
          if (local_8e0 != &local_8d0) {
            operator_delete(local_8e0.string_,local_8d0._M_allocated_capacity + 1);
          }
        }
        if (((value.map_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
          local_978._M_dataplus._M_p = (pointer)&local_978.field_2;
          local_8e0.int_ = 0x11;
          local_978._M_dataplus._M_p =
               (pointer)std::__cxx11::string::_M_create((ulong *)&local_978,(ulong)&local_8e0);
          local_978.field_2._M_allocated_capacity = (size_type)local_8e0;
          builtin_strncpy(local_978._M_dataplus._M_p,"WORKING_DIRECTORY",0x11);
          local_978._M_string_length = (size_type)local_8e0;
          local_978._M_dataplus._M_p[local_8e0.string_] = '\0';
          Json::Value::Value((Value *)&local_8e0,local_880);
          DumpCTestProperty((Value *)&local_958,&local_978,(Value *)&local_8e0);
          Json::Value::append(&local_930,(Value *)&local_958);
          Json::Value::~Value((Value *)&local_958);
          Json::Value::~Value((Value *)&local_8e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_978._M_dataplus._M_p != &local_978.field_2) {
            operator_delete(local_978._M_dataplus._M_p,local_978.field_2._M_allocated_capacity + 1);
          }
        }
        bVar3 = Json::Value::empty(&local_930);
        if (!bVar3) {
          Json::Value::Value((Value *)&local_9a0,&local_930);
          pVVar6 = Json::Value::operator[](&local_870,"properties");
          Json::Value::operator=(pVVar6,(Value *)&local_9a0);
          Json::Value::~Value((Value *)&local_9a0);
        }
        bVar3 = cmListFileBacktrace::Empty((cmListFileBacktrace *)(value.int_ + 0x2a8));
        if ((!bVar3) &&
           (bVar3 = BacktraceData::Add(&local_150,(cmListFileBacktrace *)(value.int_ + 0x2a8),
                                       (ArrayIndex *)&local_908[0].uint_), bVar3)) {
          Json::Value::Value((Value *)&local_958,(undefined4)local_908[0].uint_);
          pVVar6 = Json::Value::operator[](&local_870,"backtrace");
          Json::Value::operator=(pVVar6,(Value *)&local_958);
          Json::Value::~Value((Value *)&local_958);
        }
        Json::Value::~Value(&local_930);
        Json::Value::append(&local_760,&local_870);
        Json::Value::~Value(&local_870);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(local_180);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
        operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
      }
      if (local_1c0 != &local_1b0) {
        operator_delete(local_1c0,local_1b0._M_allocated_capacity + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_1f0);
      cmCTestTestHandler::cmCTestTestResult::~cmCTestTestResult(&local_330);
      if (local_350 != &local_340) {
        operator_delete(local_350,local_340._M_allocated_capacity + 1);
      }
      std::unique_ptr<cmProcess,_std::default_delete<cmProcess>_>::~unique_ptr(&local_358);
      cmWorkingDirectory::~cmWorkingDirectory(&local_670);
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(local_878);
    } while (p_Var7 != local_888);
  }
  BacktraceData::Dump(&local_6c0,&local_150);
  pVVar6 = Json::Value::operator[](&local_828,"backtraceGraph");
  Json::Value::operator=(pVVar6,&local_6c0);
  Json::Value::~Value(&local_6c0);
  Json::Value::Value(&local_6e8,&local_760);
  pVVar6 = Json::Value::operator[](&local_828,"tests");
  Json::Value::operator=(pVVar6,&local_6e8);
  Json::Value::~Value(&local_6e8);
  Json::StreamWriterBuilder::StreamWriterBuilder((StreamWriterBuilder *)local_378);
  Json::Value::Value(&local_710,"  ");
  local_848._M_dataplus._M_p = (pointer)&local_848.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_848,"indentation","");
  pVVar6 = Json::StreamWriterBuilder::operator[]((StreamWriterBuilder *)local_378,&local_848);
  Json::Value::operator=(pVVar6,&local_710);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_848._M_dataplus._M_p != &local_848.field_2) {
    operator_delete(local_848._M_dataplus._M_p,local_848.field_2._M_allocated_capacity + 1);
  }
  Json::Value::~Value(&local_710);
  pSVar8 = Json::StreamWriterBuilder::newStreamWriter((StreamWriterBuilder *)local_378);
  (*pSVar8->_vptr_StreamWriter[2])(pSVar8,&local_828,&std::cout);
  (*pSVar8->_vptr_StreamWriter[1])(pSVar8);
  Json::StreamWriterBuilder::~StreamWriterBuilder((StreamWriterBuilder *)local_378);
  Json::Value::~Value(&local_760);
  Json::Value::~Value(&local_150.Nodes);
  Json::Value::~Value(&local_150.Files);
  Json::Value::~Value(&local_150.Commands);
  std::
  _Hashtable<const_cmListFileContext_*,_std::pair<const_cmListFileContext_*const,_unsigned_int>,_std::allocator<std::pair<const_cmListFileContext_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmListFileContext_*>,_std::hash<const_cmListFileContext_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_150.NodeMap._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_150.FileMap._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_150);
  Json::Value::~Value(&local_828);
  return;
}

Assistant:

void cmCTestMultiProcessHandler::PrintOutputAsJson()
{
  this->TestHandler->SetMaxIndex(this->FindMaxIndex());

  Json::Value result = Json::objectValue;
  result["kind"] = "ctestInfo";
  result["version"] = DumpVersion(1, 0);

  BacktraceData backtraceGraph;
  Json::Value tests = Json::arrayValue;
  for (auto& it : this->Properties) {
    cmCTestTestHandler::cmCTestTestProperties& p = *it.second;

    // Don't worry if this fails, we are only showing the test list, not
    // running the tests
    cmWorkingDirectory workdir(p.Directory);
    cmCTestRunTest testRun(*this);
    testRun.SetIndex(p.Index);
    testRun.SetTestProperties(&p);
    testRun.ComputeArguments();

    // Skip tests not available in this configuration.
    if (p.Args.size() >= 2 && p.Args[1] == "NOT_AVAILABLE") {
      continue;
    }

    Json::Value testInfo = DumpCTestInfo(testRun, p, backtraceGraph);
    tests.append(testInfo);
  }
  result["backtraceGraph"] = backtraceGraph.Dump();
  result["tests"] = std::move(tests);

  Json::StreamWriterBuilder builder;
  builder["indentation"] = "  ";
  std::unique_ptr<Json::StreamWriter> jout(builder.newStreamWriter());
  jout->write(result, &std::cout);
}